

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

int mixed_queue_remove(mixed_segment *old,mixed_segment *segment)

{
  int iVar1;
  uint32_t local_450;
  mixed_segment_info_flags local_44c;
  uint32_t i_1;
  uint32_t i;
  mixed_segment_info info;
  queue_segment_data *data;
  mixed_segment *segment_local;
  mixed_segment *old_local;
  
  info.fields[0x1f]._24_8_ = segment->data;
  memset(&i_1,0,0x420);
  mixed_segment_end(old);
  iVar1 = vector_remove_item(old,(vector *)info.fields[0x1f]._24_8_);
  if (iVar1 == 0) {
    old_local._4_4_ = 0;
  }
  else {
    mixed_segment_info((mixed_segment_info *)&i_1,old);
    for (local_44c = 0; local_44c < info.flags; local_44c = local_44c + MIXED_IN) {
      mixed_segment_set_in(0,local_44c,(void *)0x0,old);
    }
    for (local_450 = 0; local_450 < info.min_inputs; local_450 = local_450 + 1) {
      mixed_segment_set_out(0,local_450,(void *)0x0,old);
    }
    old_local._4_4_ = 1;
  }
  return old_local._4_4_;
}

Assistant:

MIXED_EXPORT int mixed_queue_remove(struct mixed_segment *old, struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  struct mixed_segment_info info = {0};

  mixed_segment_end(old);
  // If the stop fails we remove it anyway.
  
  if(!vector_remove_item(old, (struct vector *)data))
    return 0;
    
  mixed_segment_info(&info, old);
  for(uint32_t i=0; i<info.max_inputs; ++i){
    mixed_segment_set_in(MIXED_BUFFER, i, 0, old);
  }
  for(uint32_t i=0; i<info.outputs; ++i){
    mixed_segment_set_out(MIXED_BUFFER, i, 0, old);
  }
  return 1;
}